

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_subset_format(bcf_hdr_t *hdr,bcf1_t *rec)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  bcf_fmt_t *pbVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint32_t uVar12;
  uint8_t *ptr_start;
  uint8_t *puVar13;
  byte *pbVar14;
  uint8_t *__dest;
  
  if (hdr->keep_samples != (uint8_t *)0x0) {
    if (hdr->n[2] == 0) {
      *(uint *)&rec->field_0x14 = (uint)(byte)rec->field_0x14;
      (rec->indiv).l = 0;
    }
    else {
      pbVar14 = (byte *)(rec->indiv).s;
      if ((rec->d).m_fmt < (int)(uint)(byte)rec->field_0x14) {
        uVar3 = (byte)rec->field_0x14 - 1;
        uVar3 = (int)uVar3 >> 1 | uVar3;
        uVar3 = (int)uVar3 >> 2 | uVar3;
        uVar3 = (int)uVar3 >> 4 | uVar3;
        uVar3 = (int)uVar3 >> 8 | uVar3;
        uVar3 = (int)uVar3 >> 0x10 | uVar3;
        (rec->d).m_fmt = uVar3 + 1;
        pbVar4 = (bcf_fmt_t *)realloc((rec->d).fmt,(long)(int)uVar3 * 0x20 + 0x20);
        (rec->d).fmt = pbVar4;
      }
      if (0 < (rec->d).m_fmt) {
        lVar5 = 0x1c;
        lVar7 = 0;
        do {
          puVar1 = (uint *)((long)&((rec->d).fmt)->id + lVar5);
          *puVar1 = *puVar1 & 0x7fffffff;
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 0x20;
        } while (lVar7 < (rec->d).m_fmt);
      }
      uVar8 = *(ulong *)&rec->field_0x10;
      if ((char)(uVar8 >> 0x20) != '\0') {
        uVar9 = 0;
        __dest = (uint8_t *)0x0;
        do {
          if ((*pbVar14 & 0xf) == 2) {
            pbVar10 = pbVar14 + 3;
            iVar6 = (int)*(short *)(pbVar14 + 1);
          }
          else if ((*pbVar14 & 0xf) == 1) {
            pbVar10 = pbVar14 + 2;
            iVar6 = (int)(char)pbVar14[1];
          }
          else {
            pbVar10 = pbVar14 + 5;
            iVar6 = *(int *)(pbVar14 + 1);
          }
          pbVar4 = (rec->d).fmt + uVar9;
          pbVar4->id = iVar6;
          bVar2 = *pbVar10;
          pbVar4->type = bVar2 & 0xf;
          if (*pbVar10 < 0xf0) {
            pbVar11 = pbVar10 + 1;
            uVar3 = (uint)(*pbVar10 >> 4);
          }
          else if ((pbVar10[1] & 0xf) == 2) {
            uVar3 = (uint)*(short *)(pbVar10 + 2);
            pbVar11 = pbVar10 + 4;
          }
          else if ((pbVar10[1] & 0xf) == 1) {
            uVar3 = (uint)(char)pbVar10[2];
            pbVar11 = pbVar10 + 3;
          }
          else {
            uVar3 = *(uint *)(pbVar10 + 2);
            pbVar11 = pbVar10 + 6;
          }
          pbVar4->n = uVar3;
          iVar6 = uVar3 << (bcf_type_shift[bVar2 & 0xf] & 0x1f);
          pbVar4->size = iVar6;
          pbVar4->p = pbVar11;
          *(uint *)&pbVar4->field_0x1c = (int)pbVar11 - (int)pbVar14 & 0x7fffffff;
          uVar12 = iVar6 * (uint)(uVar8 >> 0x28);
          pbVar4->p_len = uVar12;
          pbVar4 = (rec->d).fmt;
          puVar13 = pbVar4[uVar9].p;
          iVar6 = pbVar4[uVar9].size;
          if (__dest != (uint8_t *)0x0) {
            uVar8 = (ulong)*(uint *)&pbVar4[uVar9].field_0x1c & 0x7fffffff;
            memmove(pbVar4[uVar9 - 1].p + pbVar4[uVar9 - 1].p_len,puVar13 + -uVar8,uVar8);
            pbVar4 = (rec->d).fmt;
            pbVar4[uVar9].p =
                 pbVar4[uVar9 - 1].p +
                 ((ulong)*(uint *)&pbVar4[uVar9].field_0x1c & 0x7fffffff) +
                 (ulong)pbVar4[uVar9 - 1].p_len;
          }
          __dest = (rec->d).fmt[uVar9].p;
          if (0 < hdr->nsamples_ori) {
            puVar13 = puVar13 + -(long)iVar6;
            uVar3 = 0;
            do {
              __n = (size_t)(rec->d).fmt[uVar9].size;
              puVar13 = puVar13 + __n;
              if ((hdr->keep_samples[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0) {
                memmove(__dest,puVar13,__n);
                __dest = __dest + (rec->d).fmt[uVar9].size;
              }
              uVar3 = uVar3 + 1;
            } while ((int)uVar3 < hdr->nsamples_ori);
          }
          pbVar4 = (rec->d).fmt;
          puVar13 = pbVar4[uVar9].p;
          (rec->indiv).l =
               (size_t)(__dest + ((rec->indiv).l - (long)(puVar13 + pbVar4[uVar9].p_len)));
          pbVar14 = pbVar11 + (int)uVar12;
          pbVar4[uVar9].p_len = (int)__dest - (int)puVar13;
          uVar9 = uVar9 + 1;
          uVar8 = *(ulong *)&rec->field_0x10;
        } while (uVar9 < (uVar8 >> 0x20 & 0xff));
      }
      *(byte *)&rec->unpacked = (byte)rec->unpacked | 8;
      *(ulong *)&rec->field_0x10 = uVar8 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
    }
  }
  return 0;
}

Assistant:

int bcf_subset_format(const bcf_hdr_t *hdr, bcf1_t *rec)
{
    if ( !hdr->keep_samples ) return 0;
    if ( !bcf_hdr_nsamples(hdr) )
    {
        rec->indiv.l = rec->n_sample = 0;
        return 0;
    }

    int i, j;
    uint8_t *ptr = (uint8_t*)rec->indiv.s, *dst = NULL, *src;
    bcf_dec_t *dec = &rec->d;
    hts_expand(bcf_fmt_t, rec->n_fmt, dec->m_fmt, dec->fmt);
    for (i=0; i<dec->m_fmt; ++i) dec->fmt[i].p_free = 0;

    for (i=0; i<rec->n_fmt; i++)
    {
        ptr = bcf_unpack_fmt_core1(ptr, rec->n_sample, &dec->fmt[i]);
        src = dec->fmt[i].p - dec->fmt[i].size;
        if ( dst )
        {
            memmove(dec->fmt[i-1].p + dec->fmt[i-1].p_len, dec->fmt[i].p - dec->fmt[i].p_off, dec->fmt[i].p_off);
            dec->fmt[i].p = dec->fmt[i-1].p + dec->fmt[i-1].p_len + dec->fmt[i].p_off;
        }
        dst = dec->fmt[i].p;
        for (j=0; j<hdr->nsamples_ori; j++)
        {
            src += dec->fmt[i].size;
            if ( !bit_array_test(hdr->keep_samples,j) ) continue;
            memmove(dst, src, dec->fmt[i].size);
            dst += dec->fmt[i].size;
        }
        rec->indiv.l -= dec->fmt[i].p_len - (dst - dec->fmt[i].p);
        dec->fmt[i].p_len = dst - dec->fmt[i].p;
    }
    rec->unpacked |= BCF_UN_FMT;

    rec->n_sample = bcf_hdr_nsamples(hdr);
    return 0;
}